

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::DeepTiledOutputFile::Data::~Data(Data *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BufferedTile *this_00;
  TileBuffer *pTVar2;
  pointer pcVar3;
  char *pcVar4;
  _Rb_tree_node_base *p_Var5;
  pointer ppTVar6;
  pointer ppTVar7;
  pointer ppTVar8;
  _Link_type in_RSI;
  ulong uVar9;
  
  if (this->numXTiles != (int *)0x0) {
    operator_delete__(this->numXTiles);
  }
  if (this->numYTiles != (int *)0x0) {
    operator_delete__(this->numYTiles);
  }
  for (p_Var5 = (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->tileMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    this_00 = (BufferedTile *)p_Var5[1]._M_left;
    if (this_00 != (BufferedTile *)0x0) {
      anon_unknown_8::BufferedTile::~BufferedTile(this_00);
    }
    in_RSI = (_Link_type)0x28;
    operator_delete(this_00,0x28);
  }
  ppTVar6 = (this->tileBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar8 = (this->tileBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar8 != ppTVar6) {
    uVar9 = 0;
    do {
      pTVar2 = ppTVar6[uVar9];
      if (pTVar2 != (TileBuffer *)0x0) {
        if (pTVar2->compressor != (Compressor *)0x0) {
          (*pTVar2->compressor->_vptr_Compressor[1])();
        }
        if (pTVar2->sampleCountTableCompressor != (Compressor *)0x0) {
          (*pTVar2->sampleCountTableCompressor->_vptr_Compressor[1])();
        }
        IlmThread_3_4::Semaphore::~Semaphore(&pTVar2->_sem);
        pcVar3 = (pTVar2->exception)._M_dataplus._M_p;
        paVar1 = &(pTVar2->exception).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        pcVar4 = (pTVar2->sampleCountTableBuffer)._data;
        if (pcVar4 != (char *)0x0) {
          operator_delete__(pcVar4);
        }
        pcVar4 = (pTVar2->buffer)._data;
        if (pcVar4 != (char *)0x0) {
          operator_delete__(pcVar4);
        }
        in_RSI = (_Link_type)&DAT_000000b8;
        operator_delete(pTVar2,0xb8);
        ppTVar6 = (this->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar8 = (this->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)ppTVar8 - (long)ppTVar6 >> 3));
  }
  ppTVar7 = (this->slices).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar7) {
    uVar9 = 0;
    do {
      in_RSI = (_Link_type)&DAT_00000038;
      operator_delete(ppTVar7[uVar9],0x38);
      uVar9 = uVar9 + 1;
      ppTVar7 = (this->slices).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->slices).
                                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3))
    ;
  }
  std::
  _Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
  ::_M_erase((_Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
              *)(this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  ppTVar6 = (this->tileBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 != (pointer)0x0) {
    operator_delete(ppTVar6,(long)(this->tileBuffers).
                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar6
                   );
  }
  ppTVar7 = (this->slices).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar7 != (pointer)0x0) {
    operator_delete(ppTVar7,(long)(this->slices).
                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar7
                   );
  }
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&(this->tileOffsets)._offsets);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepTiledOutputFile::Data::~Data ()
{
    delete[] numXTiles;
    delete[] numYTiles;

    //
    // Delete all the tile buffers, if any still happen to exist
    //

    for (TileMap::iterator i = tileMap.begin (); i != tileMap.end (); ++i)
        delete i->second;

    for (size_t i = 0; i < tileBuffers.size (); i++)
        if (tileBuffers[i] != 0) delete tileBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];
}